

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBody.cpp
# Opt level: O1

void __thiscall
btMultiBody::fillConstraintJacobianMultiDof
          (btMultiBody *this,int link,btVector3 *contact_point,btVector3 *normal_ang,
          btVector3 *normal_lin,btScalar *jac,btAlignedObjectArray<float> *scratch_r,
          btAlignedObjectArray<btVector3> *scratch_v,btAlignedObjectArray<btMatrix3x3> *scratch_m)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  float fVar3;
  float fVar4;
  undefined8 uVar5;
  int iVar6;
  int iVar7;
  btMatrix3x3 *pbVar8;
  float *pfVar9;
  btMultibodyLink *pbVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  btMultiBody *pbVar17;
  btVector3 *pbVar18;
  btMatrix3x3 *pbVar19;
  float *pfVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  int iVar24;
  btScalar *pbVar25;
  long lVar26;
  undefined4 *puVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  btMatrix3x3 mtx;
  float *local_e8;
  btMatrix3x3 local_d8;
  long local_a8;
  long local_a0;
  undefined1 local_98 [16];
  btMultiBody *local_80;
  btVector3 *local_78;
  btVector3 *local_70;
  btVector3 *local_68;
  btVector3 *local_60;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  local_98._8_8_ = local_98._0_8_;
  local_98._0_8_ = normal_ang;
  local_a8 = (long)(this->m_links).m_size;
  iVar6 = this->m_dofCount;
  lVar26 = local_a8 * 3 + 3;
  iVar24 = (int)lVar26;
  local_80 = this;
  local_60 = normal_lin;
  if ((scratch_v->m_size < iVar24) && (scratch_v->m_capacity < iVar24)) {
    if (iVar24 == 0) {
      pbVar18 = (btVector3 *)0x0;
    }
    else {
      pbVar18 = (btVector3 *)btAlignedAllocInternal(lVar26 * 0x10,0x10);
    }
    iVar7 = scratch_v->m_size;
    if (0 < (long)iVar7) {
      lVar26 = 0;
      do {
        puVar1 = (undefined8 *)((long)scratch_v->m_data->m_floats + lVar26);
        uVar5 = puVar1[1];
        puVar2 = (undefined8 *)((long)pbVar18->m_floats + lVar26);
        *puVar2 = *puVar1;
        puVar2[1] = uVar5;
        lVar26 = lVar26 + 0x10;
      } while ((long)iVar7 * 0x10 != lVar26);
    }
    if (scratch_v->m_data != (btVector3 *)0x0) {
      if (scratch_v->m_ownsMemory == true) {
        btAlignedFreeInternal(scratch_v->m_data);
      }
      scratch_v->m_data = (btVector3 *)0x0;
    }
    scratch_v->m_ownsMemory = true;
    scratch_v->m_data = pbVar18;
    scratch_v->m_capacity = iVar24;
  }
  scratch_v->m_size = iVar24;
  iVar24 = (int)(local_a8 + 1);
  if ((scratch_m->m_size <= (int)local_a8 && scratch_m->m_size <= iVar24) &&
     (scratch_m->m_capacity <= (int)local_a8)) {
    if (iVar24 == 0) {
      pbVar19 = (btMatrix3x3 *)0x0;
    }
    else {
      pbVar19 = (btMatrix3x3 *)btAlignedAllocInternal((local_a8 + 1) * 0x30,0x10);
    }
    iVar7 = scratch_m->m_size;
    if (0 < (long)iVar7) {
      lVar26 = 0;
      do {
        pbVar8 = scratch_m->m_data;
        puVar1 = (undefined8 *)((long)pbVar8->m_el[0].m_floats + lVar26);
        uVar5 = puVar1[1];
        puVar2 = (undefined8 *)((long)pbVar19->m_el[0].m_floats + lVar26);
        *puVar2 = *puVar1;
        puVar2[1] = uVar5;
        puVar1 = (undefined8 *)((long)pbVar8->m_el[1].m_floats + lVar26);
        uVar5 = puVar1[1];
        puVar2 = (undefined8 *)((long)pbVar19->m_el[1].m_floats + lVar26);
        *puVar2 = *puVar1;
        puVar2[1] = uVar5;
        puVar2 = (undefined8 *)((long)pbVar8->m_el[2].m_floats + lVar26);
        uVar5 = puVar2[1];
        puVar1 = (undefined8 *)((long)pbVar19->m_el[2].m_floats + lVar26);
        *puVar1 = *puVar2;
        puVar1[1] = uVar5;
        lVar26 = lVar26 + 0x30;
      } while ((long)iVar7 * 0x30 != lVar26);
    }
    if (scratch_m->m_data != (btMatrix3x3 *)0x0) {
      if (scratch_m->m_ownsMemory == true) {
        btAlignedFreeInternal(scratch_m->m_data);
      }
      scratch_m->m_data = (btMatrix3x3 *)0x0;
    }
    scratch_m->m_ownsMemory = true;
    scratch_m->m_data = pbVar19;
    scratch_m->m_capacity = iVar24;
  }
  scratch_m->m_size = iVar24;
  local_78 = scratch_v->m_data;
  lVar26 = (long)iVar24;
  local_70 = local_78 + lVar26;
  iVar24 = scratch_r->m_size;
  local_a0 = lVar26;
  if ((iVar24 <= iVar6) && (iVar24 < iVar6)) {
    if (scratch_r->m_capacity < iVar6) {
      if (iVar6 == 0) {
        pfVar20 = (float *)0x0;
      }
      else {
        pfVar20 = (float *)btAlignedAllocInternal((long)iVar6 * 4,0x10);
      }
      iVar7 = scratch_r->m_size;
      if (0 < (long)iVar7) {
        pfVar9 = scratch_r->m_data;
        lVar22 = 0;
        do {
          pfVar20[lVar22] = pfVar9[lVar22];
          lVar22 = lVar22 + 1;
        } while (iVar7 != lVar22);
      }
      if (scratch_r->m_data != (float *)0x0) {
        if (scratch_r->m_ownsMemory == true) {
          btAlignedFreeInternal(scratch_r->m_data);
        }
        scratch_r->m_data = (float *)0x0;
      }
      scratch_r->m_ownsMemory = true;
      scratch_r->m_data = pfVar20;
      scratch_r->m_capacity = iVar6;
    }
    if (iVar24 < iVar6) {
      memset(scratch_r->m_data + iVar24,0,((long)iVar6 - (long)iVar24) * 4);
    }
  }
  uVar5 = local_98._0_8_;
  local_68 = local_70 + lVar26;
  scratch_r->m_size = iVar6;
  if (iVar6 < 1) {
    local_e8 = (float *)0x0;
  }
  else {
    local_e8 = scratch_r->m_data;
  }
  pbVar19 = scratch_m->m_data;
  local_98 = ZEXT416((uint)(contact_point->m_floats[0] - (local_80->m_basePos).m_floats[0]));
  local_48 = ZEXT416((uint)(contact_point->m_floats[1] - (local_80->m_basePos).m_floats[1]));
  local_58 = ZEXT416((uint)(contact_point->m_floats[2] - (local_80->m_basePos).m_floats[2]));
  btMatrix3x3::setRotation(&local_d8,&local_80->m_baseQuat);
  *(ulong *)pbVar19->m_el[0].m_floats =
       CONCAT44(local_d8.m_el[0].m_floats[1],local_d8.m_el[0].m_floats[0]);
  *(ulong *)(pbVar19->m_el[0].m_floats + 2) =
       CONCAT44(local_d8.m_el[0].m_floats[3],local_d8.m_el[0].m_floats[2]);
  *(ulong *)pbVar19->m_el[1].m_floats =
       CONCAT44(local_d8.m_el[1].m_floats[1],local_d8.m_el[1].m_floats[0]);
  *(ulong *)(pbVar19->m_el[1].m_floats + 2) =
       CONCAT44(local_d8.m_el[1].m_floats[3],local_d8.m_el[1].m_floats[2]);
  *(ulong *)pbVar19->m_el[2].m_floats =
       CONCAT44(local_d8.m_el[2].m_floats[1],local_d8.m_el[2].m_floats[0]);
  *(ulong *)(pbVar19->m_el[2].m_floats + 2) =
       CONCAT44(local_d8.m_el[2].m_floats[3],local_d8.m_el[2].m_floats[2]);
  fVar30 = local_60->m_floats[2];
  fVar3 = local_60->m_floats[0];
  fVar4 = local_60->m_floats[1];
  *jac = ((float)local_48._0_4_ * fVar30 - fVar4 * (float)local_58._0_4_) + *(float *)uVar5;
  jac[1] = ((float)local_58._0_4_ * fVar3 - fVar30 * (float)local_98._0_4_) + *(float *)(uVar5 + 4);
  jac[2] = (fVar4 * (float)local_98._0_4_ - fVar3 * (float)local_48._0_4_) + *(float *)(uVar5 + 8);
  jac[3] = local_60->m_floats[0];
  jac[4] = local_60->m_floats[1];
  jac[5] = local_60->m_floats[2];
  auVar12._4_4_ =
       (float)local_58._0_4_ * pbVar19->m_el[1].m_floats[2] +
       (float)local_98._0_4_ * pbVar19->m_el[1].m_floats[0] +
       pbVar19->m_el[1].m_floats[1] * (float)local_48._0_4_;
  auVar12._0_4_ =
       (float)local_58._0_4_ * pbVar19->m_el[0].m_floats[2] +
       (float)local_98._0_4_ * pbVar19->m_el[0].m_floats[0] +
       pbVar19->m_el[0].m_floats[1] * (float)local_48._0_4_;
  auVar12._8_4_ =
       (float)local_58._0_4_ * pbVar19->m_el[2].m_floats[2] +
       (float)local_98._0_4_ * pbVar19->m_el[2].m_floats[0] +
       (float)local_48._0_4_ * pbVar19->m_el[2].m_floats[1];
  auVar12._12_4_ = 0;
  *(undefined1 (*) [16])local_78->m_floats = auVar12;
  fVar30 = local_60->m_floats[0];
  fVar3 = local_60->m_floats[1];
  fVar4 = local_60->m_floats[2];
  auVar15._4_4_ =
       fVar4 * pbVar19->m_el[1].m_floats[2] +
       fVar30 * pbVar19->m_el[1].m_floats[0] + pbVar19->m_el[1].m_floats[1] * fVar3;
  auVar15._0_4_ =
       fVar4 * pbVar19->m_el[0].m_floats[2] +
       fVar30 * pbVar19->m_el[0].m_floats[0] + pbVar19->m_el[0].m_floats[1] * fVar3;
  auVar15._8_4_ =
       fVar4 * pbVar19->m_el[2].m_floats[2] +
       fVar30 * pbVar19->m_el[2].m_floats[0] + fVar3 * pbVar19->m_el[2].m_floats[1];
  auVar15._12_4_ = 0;
  *(undefined1 (*) [16])local_70->m_floats = auVar15;
  fVar30 = *(float *)uVar5;
  fVar3 = *(float *)(uVar5 + 4);
  fVar4 = *(float *)(uVar5 + 8);
  local_98._0_8_ = pbVar19;
  auVar16._4_4_ =
       fVar4 * pbVar19->m_el[1].m_floats[2] +
       fVar30 * pbVar19->m_el[1].m_floats[0] + pbVar19->m_el[1].m_floats[1] * fVar3;
  auVar16._0_4_ =
       fVar4 * pbVar19->m_el[0].m_floats[2] +
       fVar30 * pbVar19->m_el[0].m_floats[0] + pbVar19->m_el[0].m_floats[1] * fVar3;
  auVar16._8_4_ =
       fVar4 * pbVar19->m_el[2].m_floats[2] +
       fVar30 * pbVar19->m_el[2].m_floats[0] + fVar3 * pbVar19->m_el[2].m_floats[1];
  auVar16._12_4_ = 0;
  *(undefined1 (*) [16])local_68->m_floats = auVar16;
  if (0 < iVar6) {
    iVar24 = 6;
    if (6 < iVar6 + 5) {
      iVar24 = iVar6 + 5;
    }
    memset(jac + 6,0,(ulong)(iVar24 - 5) << 2);
  }
  pbVar17 = local_80;
  if (-1 < link && 0 < (int)local_a8) {
    local_a8 = local_a8 * 600;
    pbVar25 = local_78[1].m_floats + 2;
    local_a0 = local_a0 << 5;
    puVar27 = (undefined4 *)(local_98._0_8_ + 0x5c);
    lVar22 = 0;
    do {
      pbVar10 = (pbVar17->m_links).m_data;
      iVar6 = *(int *)((long)(pbVar10->m_zeroRotParentToThis).super_btQuadWord.m_floats +
                      lVar22 + -4);
      btMatrix3x3::setRotation
                (&local_d8,
                 (btQuaternion *)
                 ((long)(pbVar10->m_cachedRotParentToThis).super_btQuadWord.m_floats + lVar22));
      lVar23 = (long)iVar6 + 1;
      lVar21 = lVar23 * 0x30;
      fVar30 = *(float *)(local_98._0_8_ + 8 + lVar21);
      fVar3 = *(float *)(local_98._0_8_ + 0x18 + lVar21);
      fVar4 = *(float *)(local_98._0_8_ + 0x28 + lVar21);
      uVar5 = *(undefined8 *)(local_98._0_8_ + 0x10 + lVar21);
      fVar33 = (float)uVar5;
      fVar34 = (float)((ulong)uVar5 >> 0x20);
      fVar31 = (float)*(undefined8 *)(local_98._0_8_ + lVar21);
      fVar32 = (float)((ulong)*(undefined8 *)(local_98._0_8_ + lVar21) >> 0x20);
      uVar5 = *(undefined8 *)(local_98._0_8_ + 0x20 + lVar21);
      fVar28 = (float)uVar5;
      fVar29 = (float)((ulong)uVar5 >> 0x20);
      *(ulong *)(puVar27 + -0xb) =
           CONCAT44(local_d8.m_el[0].m_floats[2] * fVar29 +
                    local_d8.m_el[0].m_floats[0] * fVar32 + local_d8.m_el[0].m_floats[1] * fVar34,
                    local_d8.m_el[0].m_floats[2] * fVar28 +
                    local_d8.m_el[0].m_floats[0] * fVar31 + local_d8.m_el[0].m_floats[1] * fVar33);
      puVar27[-9] = fVar4 * local_d8.m_el[0].m_floats[2] +
                    fVar30 * local_d8.m_el[0].m_floats[0] + local_d8.m_el[0].m_floats[1] * fVar3;
      puVar27[-8] = 0;
      *(ulong *)(puVar27 + -7) =
           CONCAT44(local_d8.m_el[1].m_floats[2] * fVar29 +
                    local_d8.m_el[1].m_floats[0] * fVar32 + local_d8.m_el[1].m_floats[1] * fVar34,
                    local_d8.m_el[1].m_floats[2] * fVar28 +
                    local_d8.m_el[1].m_floats[0] * fVar31 + local_d8.m_el[1].m_floats[1] * fVar33);
      puVar27[-5] = fVar4 * local_d8.m_el[1].m_floats[2] +
                    fVar30 * local_d8.m_el[1].m_floats[0] + fVar3 * local_d8.m_el[1].m_floats[1];
      puVar27[-4] = 0;
      *(ulong *)(puVar27 + -3) =
           CONCAT44(local_d8.m_el[2].m_floats[2] * fVar29 +
                    local_d8.m_el[2].m_floats[0] * fVar32 + local_d8.m_el[2].m_floats[1] * fVar34,
                    local_d8.m_el[2].m_floats[2] * fVar28 +
                    local_d8.m_el[2].m_floats[0] * fVar31 + local_d8.m_el[2].m_floats[1] * fVar33);
      puVar27[-1] = fVar4 * local_d8.m_el[2].m_floats[2] +
                    fVar30 * local_d8.m_el[2].m_floats[0] + fVar3 * local_d8.m_el[2].m_floats[1];
      *puVar27 = 0;
      fVar30 = local_70[lVar23].m_floats[0];
      fVar3 = local_70[lVar23].m_floats[1];
      fVar4 = local_70[lVar23].m_floats[2];
      auVar13._4_4_ =
           fVar4 * local_d8.m_el[1].m_floats[2] +
           fVar30 * local_d8.m_el[1].m_floats[0] + local_d8.m_el[1].m_floats[1] * fVar3;
      auVar13._0_4_ =
           fVar4 * local_d8.m_el[0].m_floats[2] +
           fVar30 * local_d8.m_el[0].m_floats[0] + local_d8.m_el[0].m_floats[1] * fVar3;
      auVar13._8_4_ =
           fVar4 * local_d8.m_el[2].m_floats[2] +
           fVar30 * local_d8.m_el[2].m_floats[0] + fVar3 * local_d8.m_el[2].m_floats[1];
      auVar13._12_4_ = 0;
      *(undefined1 (*) [16])(pbVar25 + lVar26 * 4 + -2) = auVar13;
      fVar30 = local_68[lVar23].m_floats[0];
      fVar3 = local_68[lVar23].m_floats[1];
      fVar4 = local_68[lVar23].m_floats[2];
      auVar14._4_4_ =
           fVar4 * local_d8.m_el[1].m_floats[2] +
           fVar30 * local_d8.m_el[1].m_floats[0] + local_d8.m_el[1].m_floats[1] * fVar3;
      auVar14._0_4_ =
           fVar4 * local_d8.m_el[0].m_floats[2] +
           fVar30 * local_d8.m_el[0].m_floats[0] + local_d8.m_el[0].m_floats[1] * fVar3;
      auVar14._8_4_ =
           fVar4 * local_d8.m_el[2].m_floats[2] +
           fVar30 * local_d8.m_el[2].m_floats[0] + fVar3 * local_d8.m_el[2].m_floats[1];
      auVar14._12_4_ = 0;
      *(undefined1 (*) [16])((long)pbVar25 + local_a0 + -8) = auVar14;
      fVar30 = local_78[lVar23].m_floats[0];
      fVar3 = local_78[lVar23].m_floats[1];
      fVar4 = local_78[lVar23].m_floats[2];
      pbVar10 = (pbVar17->m_links).m_data;
      uVar5 = *(undefined8 *)((long)(pbVar10->m_cachedRVector).m_floats + lVar22);
      auVar11._4_4_ =
           (fVar4 * local_d8.m_el[1].m_floats[2] +
           fVar30 * local_d8.m_el[1].m_floats[0] + local_d8.m_el[1].m_floats[1] * fVar3) -
           (float)((ulong)uVar5 >> 0x20);
      auVar11._0_4_ =
           (fVar4 * local_d8.m_el[0].m_floats[2] +
           fVar30 * local_d8.m_el[0].m_floats[0] + local_d8.m_el[0].m_floats[1] * fVar3) -
           (float)uVar5;
      auVar11._8_4_ =
           (local_d8.m_el[2].m_floats[2] * fVar4 +
           local_d8.m_el[2].m_floats[0] * fVar30 + local_d8.m_el[2].m_floats[1] * fVar3) -
           *(float *)((long)(pbVar10->m_cachedRVector).m_floats + lVar22 + 8);
      auVar11._12_4_ = 0;
      *(undefined1 (*) [16])((btVector3 *)(pbVar25 + -2))->m_floats = auVar11;
      pbVar10 = (pbVar17->m_links).m_data;
      switch(*(undefined4 *)
              ((long)(pbVar10->m_cachedWorldTransform).m_basis.m_el[0].m_floats + lVar22 + -0xc)) {
      case 0:
        fVar30 = *(float *)((long)pbVar10->m_axes[0].m_topVec.m_floats + lVar22);
        fVar3 = *(float *)((long)pbVar10->m_axes[0].m_topVec.m_floats + lVar22 + 4);
        fVar4 = *(float *)((long)pbVar10->m_axes[0].m_topVec.m_floats + lVar22 + 8);
        fVar30 = ((fVar30 * pbVar25[-1] - ((btVector3 *)(pbVar25 + -2))->m_floats[0] * fVar3) +
                 *(float *)((long)pbVar10->m_axes[0].m_bottomVec.m_floats + lVar22 + 8)) *
                 pbVar25[lVar26 * 4] +
                 ((fVar3 * *pbVar25 - pbVar25[-1] * fVar4) +
                 *(float *)((long)pbVar10->m_axes[0].m_bottomVec.m_floats + lVar22)) *
                 pbVar25[lVar26 * 4 + -2] +
                 ((fVar4 * ((btVector3 *)(pbVar25 + -2))->m_floats[0] - *pbVar25 * fVar30) +
                 *(float *)((long)pbVar10->m_axes[0].m_bottomVec.m_floats + lVar22 + 4)) *
                 pbVar25[lVar26 * 4 + -1];
        iVar6 = *(int *)((long)(pbVar10->m_cachedRotParentToThis).super_btQuadWord.m_floats +
                        lVar22 + -8);
        local_e8[iVar6] = fVar30;
        local_e8[iVar6] =
             *(float *)((long)pbVar25 + local_a0) *
             *(float *)((long)pbVar10->m_axes[0].m_topVec.m_floats + lVar22 + 8) +
             *(float *)((long)pbVar25 + local_a0 + -8) *
             *(float *)((long)pbVar10->m_axes[0].m_topVec.m_floats + lVar22) +
             *(float *)((long)pbVar25 + local_a0 + -4) *
             *(float *)((long)pbVar10->m_axes[0].m_topVec.m_floats + lVar22 + 4) + fVar30;
        break;
      case 1:
        local_e8[*(int *)((long)(pbVar10->m_cachedRotParentToThis).super_btQuadWord.m_floats +
                         lVar22 + -8)] =
             pbVar25[lVar26 * 4] *
             *(float *)((long)pbVar10->m_axes[0].m_bottomVec.m_floats + lVar22 + 8) +
             pbVar25[lVar26 * 4 + -2] *
             *(float *)((long)pbVar10->m_axes[0].m_bottomVec.m_floats + lVar22) +
             pbVar25[lVar26 * 4 + -1] *
             *(float *)((long)pbVar10->m_axes[0].m_bottomVec.m_floats + lVar22 + 4);
        break;
      case 2:
        fVar30 = *(float *)((long)pbVar10->m_axes[0].m_topVec.m_floats + lVar22);
        fVar3 = *(float *)((long)pbVar10->m_axes[0].m_topVec.m_floats + lVar22 + 4);
        fVar4 = *(float *)((long)pbVar10->m_axes[0].m_topVec.m_floats + lVar22 + 8);
        fVar28 = ((fVar30 * pbVar25[-1] - ((btVector3 *)(pbVar25 + -2))->m_floats[0] * fVar3) +
                 *(float *)((long)pbVar10->m_axes[0].m_bottomVec.m_floats + lVar22 + 8)) *
                 pbVar25[lVar26 * 4] +
                 ((fVar3 * *pbVar25 - pbVar25[-1] * fVar4) +
                 *(float *)((long)pbVar10->m_axes[0].m_bottomVec.m_floats + lVar22)) *
                 pbVar25[lVar26 * 4 + -2] +
                 ((fVar4 * ((btVector3 *)(pbVar25 + -2))->m_floats[0] - *pbVar25 * fVar30) +
                 *(float *)((long)pbVar10->m_axes[0].m_bottomVec.m_floats + lVar22 + 4)) *
                 pbVar25[lVar26 * 4 + -1];
        lVar21 = (long)*(int *)((long)(pbVar10->m_cachedRotParentToThis).super_btQuadWord.m_floats +
                               lVar22 + -8);
        local_e8[lVar21] = fVar28;
        fVar30 = *(float *)((long)pbVar10->m_axes[1].m_topVec.m_floats + lVar22);
        fVar3 = *(float *)((long)pbVar10->m_axes[1].m_topVec.m_floats + lVar22 + 4);
        fVar4 = *(float *)((long)pbVar10->m_axes[1].m_topVec.m_floats + lVar22 + 8);
        fVar29 = ((fVar30 * pbVar25[-1] - ((btVector3 *)(pbVar25 + -2))->m_floats[0] * fVar3) +
                 *(float *)((long)pbVar10->m_axes[1].m_bottomVec.m_floats + lVar22 + 8)) *
                 pbVar25[lVar26 * 4] +
                 ((fVar3 * *pbVar25 - pbVar25[-1] * fVar4) +
                 *(float *)((long)pbVar10->m_axes[1].m_bottomVec.m_floats + lVar22)) *
                 pbVar25[lVar26 * 4 + -2] +
                 ((fVar4 * ((btVector3 *)(pbVar25 + -2))->m_floats[0] - *pbVar25 * fVar30) +
                 *(float *)((long)pbVar10->m_axes[1].m_bottomVec.m_floats + lVar22 + 4)) *
                 pbVar25[lVar26 * 4 + -1];
        local_e8[lVar21 + 1] = fVar29;
        fVar30 = *(float *)((long)pbVar10->m_axes[2].m_topVec.m_floats + lVar22);
        fVar3 = *(float *)((long)pbVar10->m_axes[2].m_topVec.m_floats + lVar22 + 4);
        fVar4 = *(float *)((long)pbVar10->m_axes[2].m_topVec.m_floats + lVar22 + 8);
        fVar30 = ((fVar30 * pbVar25[-1] - ((btVector3 *)(pbVar25 + -2))->m_floats[0] * fVar3) +
                 *(float *)((long)pbVar10->m_axes[2].m_bottomVec.m_floats + lVar22 + 8)) *
                 pbVar25[lVar26 * 4] +
                 ((fVar3 * *pbVar25 - pbVar25[-1] * fVar4) +
                 *(float *)((long)pbVar10->m_axes[2].m_bottomVec.m_floats + lVar22)) *
                 pbVar25[lVar26 * 4 + -2] +
                 ((fVar4 * ((btVector3 *)(pbVar25 + -2))->m_floats[0] - *pbVar25 * fVar30) +
                 *(float *)((long)pbVar10->m_axes[2].m_bottomVec.m_floats + lVar22 + 4)) *
                 pbVar25[lVar26 * 4 + -1];
        local_e8[lVar21 + 2] = fVar30;
        local_e8[lVar21] =
             *(float *)((long)pbVar25 + local_a0) *
             *(float *)((long)pbVar10->m_axes[0].m_topVec.m_floats + lVar22 + 8) +
             *(float *)((long)pbVar25 + local_a0 + -8) *
             *(float *)((long)pbVar10->m_axes[0].m_topVec.m_floats + lVar22) +
             *(float *)((long)pbVar25 + local_a0 + -4) *
             *(float *)((long)pbVar10->m_axes[0].m_topVec.m_floats + lVar22 + 4) + fVar28;
        local_e8[lVar21 + 1] =
             *(float *)((long)pbVar25 + local_a0) *
             *(float *)((long)pbVar10->m_axes[1].m_topVec.m_floats + lVar22 + 8) +
             *(float *)((long)pbVar25 + local_a0 + -8) *
             *(float *)((long)pbVar10->m_axes[1].m_topVec.m_floats + lVar22) +
             *(float *)((long)pbVar25 + local_a0 + -4) *
             *(float *)((long)pbVar10->m_axes[1].m_topVec.m_floats + lVar22 + 4) + fVar29;
        local_e8[lVar21 + 2] =
             *(float *)((long)pbVar25 + local_a0) *
             *(float *)((long)pbVar10->m_axes[2].m_topVec.m_floats + lVar22 + 8) +
             *(float *)((long)pbVar25 + local_a0 + -8) *
             *(float *)((long)pbVar10->m_axes[2].m_topVec.m_floats + lVar22) +
             *(float *)((long)pbVar25 + local_a0 + -4) *
             *(float *)((long)pbVar10->m_axes[2].m_topVec.m_floats + lVar22 + 4) + fVar30;
        break;
      case 3:
        fVar30 = *(float *)((long)pbVar10->m_axes[0].m_topVec.m_floats + lVar22);
        fVar3 = *(float *)((long)pbVar10->m_axes[0].m_topVec.m_floats + lVar22 + 4);
        fVar4 = *(float *)((long)pbVar10->m_axes[0].m_topVec.m_floats + lVar22 + 8);
        lVar21 = (long)*(int *)((long)(pbVar10->m_cachedRotParentToThis).super_btQuadWord.m_floats +
                               lVar22 + -8);
        local_e8[lVar21] =
             (fVar30 * pbVar25[-1] - ((btVector3 *)(pbVar25 + -2))->m_floats[0] * fVar3) *
             pbVar25[lVar26 * 4] +
             (fVar3 * *pbVar25 - pbVar25[-1] * fVar4) * pbVar25[lVar26 * 4 + -2] +
             (fVar4 * ((btVector3 *)(pbVar25 + -2))->m_floats[0] - *pbVar25 * fVar30) *
             pbVar25[lVar26 * 4 + -1];
        local_e8[lVar21 + 1] =
             pbVar25[lVar26 * 4] *
             *(float *)((long)pbVar10->m_axes[1].m_bottomVec.m_floats + lVar22 + 8) +
             pbVar25[lVar26 * 4 + -2] *
             *(float *)((long)pbVar10->m_axes[1].m_bottomVec.m_floats + lVar22) +
             pbVar25[lVar26 * 4 + -1] *
             *(float *)((long)pbVar10->m_axes[1].m_bottomVec.m_floats + lVar22 + 4);
        local_e8[lVar21 + 2] =
             pbVar25[lVar26 * 4] *
             *(float *)((long)pbVar10->m_axes[2].m_bottomVec.m_floats + lVar22 + 8) +
             pbVar25[lVar26 * 4 + -2] *
             *(float *)((long)pbVar10->m_axes[2].m_bottomVec.m_floats + lVar22) +
             pbVar25[lVar26 * 4 + -1] *
             *(float *)((long)pbVar10->m_axes[2].m_bottomVec.m_floats + lVar22 + 4);
      }
      lVar22 = lVar22 + 600;
      pbVar25 = pbVar25 + 4;
      puVar27 = puVar27 + 0xc;
    } while (local_a8 != lVar22);
    if (link != -1) {
      pbVar10 = (local_80->m_links).m_data;
      do {
        iVar6 = pbVar10[link].m_dofCount;
        if (0 < (long)iVar6) {
          iVar24 = pbVar10[link].m_dofOffset;
          lVar26 = 0;
          do {
            jac[iVar24 + 6 + (int)lVar26] = local_e8[iVar24 + lVar26];
            lVar26 = lVar26 + 1;
          } while (iVar6 != lVar26);
        }
        link = pbVar10[link].m_parent;
      } while (link != -1);
    }
  }
  return;
}

Assistant:

void btMultiBody::fillConstraintJacobianMultiDof(int link,
                                    const btVector3 &contact_point,
									const btVector3 &normal_ang,
                                    const btVector3 &normal_lin,
                                    btScalar *jac,
                                    btAlignedObjectArray<btScalar> &scratch_r,
                                    btAlignedObjectArray<btVector3> &scratch_v,
                                    btAlignedObjectArray<btMatrix3x3> &scratch_m) const
{
    // temporary space
	int num_links = getNumLinks();
	int m_dofCount = getNumDofs();
    scratch_v.resize(3*num_links + 3);			//(num_links + base) offsets + (num_links + base) normals_lin + (num_links + base) normals_ang
    scratch_m.resize(num_links + 1);

    btVector3 * v_ptr = &scratch_v[0];
    btVector3 * p_minus_com_local = v_ptr; v_ptr += num_links + 1;
    btVector3 * n_local_lin = v_ptr; v_ptr += num_links + 1;
	btVector3 * n_local_ang = v_ptr; v_ptr += num_links + 1;
    btAssert(v_ptr - &scratch_v[0] == scratch_v.size());

    scratch_r.resize(m_dofCount);
    btScalar * results = m_dofCount > 0 ? &scratch_r[0] : 0;

    btMatrix3x3 * rot_from_world = &scratch_m[0];

    const btVector3 p_minus_com_world = contact_point - m_basePos;
	const btVector3 &normal_lin_world = normal_lin;							//convenience
	const btVector3 &normal_ang_world = normal_ang;

    rot_from_world[0] = btMatrix3x3(m_baseQuat);    
    
    // omega coeffients first.
    btVector3 omega_coeffs_world;
    omega_coeffs_world = p_minus_com_world.cross(normal_lin_world);
	jac[0] = omega_coeffs_world[0] + normal_ang_world[0];
	jac[1] = omega_coeffs_world[1] + normal_ang_world[1];
	jac[2] = omega_coeffs_world[2] + normal_ang_world[2];
    // then v coefficients
    jac[3] = normal_lin_world[0];
    jac[4] = normal_lin_world[1];
    jac[5] = normal_lin_world[2];

	//create link-local versions of p_minus_com and normal
	p_minus_com_local[0] = rot_from_world[0] * p_minus_com_world;
    n_local_lin[0] = rot_from_world[0] * normal_lin_world;
	n_local_ang[0] = rot_from_world[0] * normal_ang_world;

    // Set remaining jac values to zero for now.
    for (int i = 6; i < 6 + m_dofCount; ++i) 
	{
        jac[i] = 0;
    }

    // Qdot coefficients, if necessary.
    if (num_links > 0 && link > -1) {

        // TODO: speed this up -- don't calculate for m_links we don't need.
        // (Also, we are making 3 separate calls to this function, for the normal & the 2 friction directions,
        // which is resulting in repeated work being done...)

        // calculate required normals & positions in the local frames.
        for (int i = 0; i < num_links; ++i) {

            // transform to local frame
            const int parent = m_links[i].m_parent;
            const btMatrix3x3 mtx(m_links[i].m_cachedRotParentToThis);
            rot_from_world[i+1] = mtx * rot_from_world[parent+1];

            n_local_lin[i+1] = mtx * n_local_lin[parent+1];
			n_local_ang[i+1] = mtx * n_local_ang[parent+1];
            p_minus_com_local[i+1] = mtx * p_minus_com_local[parent+1] - m_links[i].m_cachedRVector;

			// calculate the jacobian entry
			switch(m_links[i].m_jointType)
			{
				case btMultibodyLink::eRevolute:
				{
					results[m_links[i].m_dofOffset] = n_local_lin[i+1].dot(m_links[i].getAxisTop(0).cross(p_minus_com_local[i+1]) + m_links[i].getAxisBottom(0));
					results[m_links[i].m_dofOffset] += n_local_ang[i+1].dot(m_links[i].getAxisTop(0));
					break;
				}
				case btMultibodyLink::ePrismatic:
				{
					results[m_links[i].m_dofOffset] = n_local_lin[i+1].dot(m_links[i].getAxisBottom(0));
					break;
				}
				case btMultibodyLink::eSpherical:
				{
					results[m_links[i].m_dofOffset + 0] = n_local_lin[i+1].dot(m_links[i].getAxisTop(0).cross(p_minus_com_local[i+1]) + m_links[i].getAxisBottom(0));
					results[m_links[i].m_dofOffset + 1] = n_local_lin[i+1].dot(m_links[i].getAxisTop(1).cross(p_minus_com_local[i+1]) + m_links[i].getAxisBottom(1));
					results[m_links[i].m_dofOffset + 2] = n_local_lin[i+1].dot(m_links[i].getAxisTop(2).cross(p_minus_com_local[i+1]) + m_links[i].getAxisBottom(2));
										
					results[m_links[i].m_dofOffset + 0] += n_local_ang[i+1].dot(m_links[i].getAxisTop(0));
					results[m_links[i].m_dofOffset + 1] += n_local_ang[i+1].dot(m_links[i].getAxisTop(1));
					results[m_links[i].m_dofOffset + 2] += n_local_ang[i+1].dot(m_links[i].getAxisTop(2));

					break;
				}
				case btMultibodyLink::ePlanar:
				{
					results[m_links[i].m_dofOffset + 0] = n_local_lin[i+1].dot(m_links[i].getAxisTop(0).cross(p_minus_com_local[i+1]));// + m_links[i].getAxisBottom(0));
					results[m_links[i].m_dofOffset + 1] = n_local_lin[i+1].dot(m_links[i].getAxisBottom(1));
					results[m_links[i].m_dofOffset + 2] = n_local_lin[i+1].dot(m_links[i].getAxisBottom(2));

					break;
				}
				default:
				{
				}
			}
            
        }

        // Now copy through to output.
		//printf("jac[%d] = ", link);
        while (link != -1) 
		{
			for(int dof = 0; dof < m_links[link].m_dofCount; ++dof)
			{
				jac[6 + m_links[link].m_dofOffset + dof] = results[m_links[link].m_dofOffset + dof];
				//printf("%.2f\t", jac[6 + m_links[link].m_dofOffset + dof]);
			}
            
			link = m_links[link].m_parent;
        }
		//printf("]\n");
    }
}